

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

xmlXPathContextPtr xmlXPtrNewContext(xmlDocPtr doc,xmlNodePtr here,xmlNodePtr origin)

{
  xmlXPathContextPtr ctxt;
  
  ctxt = xmlXPathNewContext(doc);
  if (ctxt != (xmlXPathContextPtr)0x0) {
    ctxt->xptr = 1;
    ctxt->here = here;
    ctxt->origin = origin;
    xmlXPathRegisterFunc(ctxt,"range",xmlXPtrRangeFunction);
    xmlXPathRegisterFunc(ctxt,(xmlChar *)"range-inside",xmlXPtrRangeInsideFunction);
    xmlXPathRegisterFunc(ctxt,(xmlChar *)"string-range",xmlXPtrStringRangeFunction);
    xmlXPathRegisterFunc(ctxt,(xmlChar *)"start-point",xmlXPtrStartPointFunction);
    xmlXPathRegisterFunc(ctxt,(xmlChar *)"end-point",xmlXPtrEndPointFunction);
    xmlXPathRegisterFunc(ctxt,"here",xmlXPtrHereFunction);
    xmlXPathRegisterFunc(ctxt,(xmlChar *)" origin",xmlXPtrOriginFunction);
  }
  return ctxt;
}

Assistant:

xmlXPathContextPtr
xmlXPtrNewContext(xmlDocPtr doc, xmlNodePtr here, xmlNodePtr origin) {
    xmlXPathContextPtr ret;

    ret = xmlXPathNewContext(doc);
    if (ret == NULL)
	return(ret);
    ret->xptr = 1;
    ret->here = here;
    ret->origin = origin;

    xmlXPathRegisterFunc(ret, (xmlChar *)"range",
	                 xmlXPtrRangeFunction);
    xmlXPathRegisterFunc(ret, (xmlChar *)"range-inside",
	                 xmlXPtrRangeInsideFunction);
    xmlXPathRegisterFunc(ret, (xmlChar *)"string-range",
	                 xmlXPtrStringRangeFunction);
    xmlXPathRegisterFunc(ret, (xmlChar *)"start-point",
	                 xmlXPtrStartPointFunction);
    xmlXPathRegisterFunc(ret, (xmlChar *)"end-point",
	                 xmlXPtrEndPointFunction);
    xmlXPathRegisterFunc(ret, (xmlChar *)"here",
	                 xmlXPtrHereFunction);
    xmlXPathRegisterFunc(ret, (xmlChar *)" origin",
	                 xmlXPtrOriginFunction);

    return(ret);
}